

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeepsMD.cpp
# Opt level: O2

void __thiscall PeepsMD::ProcessImplicitRegs(PeepsMD *this,Instr *instr)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  RegOpnd *pRVar5;
  Peeps *pPVar6;
  RegNum RStack_30;
  
  bVar3 = LowererMD::IsCall(instr);
  if (bVar3) {
    Peeps::ClearReg(this->peeps,RegRAX);
    Peeps::ClearReg(this->peeps,RegArg3);
    Peeps::ClearReg(this->peeps,RegArg2);
    Peeps::ClearReg(this->peeps,RegArg1);
    Peeps::ClearReg(this->peeps,RegArg0);
    Peeps::ClearReg(this->peeps,RegArg4);
    Peeps::ClearReg(this->peeps,RegArg5);
    Peeps::ClearReg(this->peeps,RegR10);
    Peeps::ClearReg(this->peeps,RegR11);
    Peeps::ClearReg(this->peeps,RegXMM0);
    Peeps::ClearReg(this->peeps,RegXMM1);
    Peeps::ClearReg(this->peeps,RegXMM2);
    Peeps::ClearReg(this->peeps,RegXMM3);
    Peeps::ClearReg(this->peeps,RegXMM4);
    Peeps::ClearReg(this->peeps,RegXMM5);
    Peeps::ClearReg(this->peeps,RegXMM6);
    Peeps::ClearReg(this->peeps,RegXMM7);
    Peeps::ClearReg(this->peeps,RegXMM8);
    Peeps::ClearReg(this->peeps,RegXMM9);
    Peeps::ClearReg(this->peeps,RegXMM10);
    Peeps::ClearReg(this->peeps,RegXMM11);
    Peeps::ClearReg(this->peeps,RegXMM12);
    Peeps::ClearReg(this->peeps,RegXMM13);
    Peeps::ClearReg(this->peeps,RegXMM14);
    pPVar6 = this->peeps;
    RStack_30 = RegXMM15;
  }
  else {
    OVar1 = instr->m_opcode;
    if ((OVar1 == DIV) || (OVar1 == IDIV)) {
      pRVar5 = IR::Opnd::AsRegOpnd(instr->m_dst);
      if (pRVar5->m_reg == RegArg2) {
        pPVar6 = this->peeps;
        RStack_30 = RegRAX;
        goto LAB_005d2060;
      }
      pRVar5 = IR::Opnd::AsRegOpnd(instr->m_dst);
      if (pRVar5->m_reg != RegRAX) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PeepsMD.cpp"
                           ,0x28,"(instr->GetDst()->AsRegOpnd()->GetReg() == RegRAX)",
                           "instr->GetDst()->AsRegOpnd()->GetReg() == RegRAX");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
    }
    else {
      if (OVar1 == XCHG) {
        bVar3 = IR::Opnd::IsRegOpnd(instr->m_src1);
        if (bVar3) {
          pPVar6 = this->peeps;
          pRVar5 = IR::Opnd::AsRegOpnd(instr->m_src1);
          Peeps::ClearReg(pPVar6,pRVar5->m_reg);
        }
        bVar3 = IR::Opnd::IsRegOpnd(instr->m_src2);
        if (!bVar3) {
          return;
        }
        pPVar6 = this->peeps;
        pRVar5 = IR::Opnd::AsRegOpnd(instr->m_src2);
        RStack_30 = pRVar5->m_reg;
        goto LAB_005d2060;
      }
      if (OVar1 != IMUL) {
        return;
      }
    }
    pPVar6 = this->peeps;
    RStack_30 = RegArg2;
  }
LAB_005d2060:
  Peeps::ClearReg(pPVar6,RStack_30);
  return;
}

Assistant:

void
PeepsMD::ProcessImplicitRegs(IR::Instr *instr)
{
    if (LowererMD::IsCall(instr))
    {
#define REGDAT(Name, Listing, Encode, Type, BitVec) \
        if (!((BitVec) & (RA_CALLEESAVE | RA_DONTALLOCATE))) \
        { \
            this->peeps->ClearReg(Reg ## Name); \
        }
#include "RegList.h"
    }
    else if (instr->m_opcode == Js::OpCode::IMUL)
    {
        this->peeps->ClearReg(RegRDX);
    }
    else if (instr->m_opcode == Js::OpCode::IDIV || instr->m_opcode == Js::OpCode::DIV)
    {
        if (instr->GetDst()->AsRegOpnd()->GetReg() == RegRDX)
        {
            this->peeps->ClearReg(RegRAX);
        }
        else
        {
            Assert(instr->GetDst()->AsRegOpnd()->GetReg() == RegRAX);
            this->peeps->ClearReg(RegRDX);
        }
    }
    else if (instr->m_opcode == Js::OpCode::XCHG)
    {
        // At time of writing, I believe that src1 is always identical to dst, but clear both for robustness.

        // Either of XCHG's operands (but not both) can be a memory address, so only clear registers.
        if (instr->GetSrc1()->IsRegOpnd())
        {
            this->peeps->ClearReg(instr->GetSrc1()->AsRegOpnd()->GetReg());
        }
        if (instr->GetSrc2()->IsRegOpnd())
        {
            this->peeps->ClearReg(instr->GetSrc2()->AsRegOpnd()->GetReg());
        }
    }
}